

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O1

QSet<QtGraphicsAnchorLayout::AnchorData_*> __thiscall
QSet<QtGraphicsAnchorLayout::AnchorData_*>::intersected_helper
          (QSet<QtGraphicsAnchorLayout::AnchorData_*> *this,
          QSet<QtGraphicsAnchorLayout::AnchorData_*> *lhs,
          QSet<QtGraphicsAnchorLayout::AnchorData_*> *rhs)

{
  Span *pSVar1;
  Data *this_00;
  Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *pNVar2;
  ulong uVar3;
  ulong uVar4;
  Data *pDVar5;
  size_t size;
  size_t sVar6;
  size_t sVar7;
  Entry *key;
  long in_FS_OFFSET;
  const_iterator cVar8;
  QHashDummyValue local_41;
  anon_struct_8_1_898a9ca8_for_storage local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->q_hash).d = (Data *)0x0;
  pDVar5 = (lhs->q_hash).d;
  if (pDVar5 == (Data *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = pDVar5->size;
  }
  pDVar5 = (rhs->q_hash).d;
  if (pDVar5 == (Data *)0x0) {
    sVar7 = 0;
  }
  else {
    sVar7 = pDVar5->size;
  }
  size = sVar6;
  if ((long)sVar7 < (long)sVar6) {
    size = sVar7;
  }
  QHash<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>::reserve(&this->q_hash,size);
  if ((long)sVar6 <= (long)sVar7) {
    pDVar5 = (lhs->q_hash).d;
    if (pDVar5 == (Data *)0x0) {
      pDVar5 = (Data *)0x0;
LAB_005d2479:
      uVar4 = 0;
    }
    else {
      if (pDVar5->spans->offsets[0] != 0xff) goto LAB_005d2479;
      uVar3 = 1;
      do {
        uVar4 = uVar3;
        if (pDVar5->numBuckets == uVar4) {
          pDVar5 = (Data *)0x0;
          uVar4 = 0;
          break;
        }
        uVar3 = uVar4 + 1;
      } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    }
    if (uVar4 != 0 || pDVar5 != (Data *)0x0) {
      do {
        this_00 = (rhs->q_hash).d;
        if (this_00 != (Data *)0x0) {
          key = pDVar5->spans[uVar4 >> 7].entries +
                pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f];
          pNVar2 = QHashPrivate::
                   Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>>::
                   findNode<QtGraphicsAnchorLayout::AnchorData*>
                             ((Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>>
                               *)this_00,(AnchorData **)key);
          if (pNVar2 != (Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue> *)0x0) {
            local_40.data = *&(key->storage).data;
            QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>::
            emplace<QHashDummyValue_const&>
                      ((QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue> *)this,
                       (AnchorData **)&local_40,&local_41);
          }
        }
        do {
          if (pDVar5->numBuckets - 1 == uVar4) {
            uVar4 = 0;
            pDVar5 = (Data *)0x0;
            break;
          }
          uVar4 = uVar4 + 1;
        } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
      } while (uVar4 != 0 || pDVar5 != (Data *)0x0);
    }
    goto LAB_005d252a;
  }
  pDVar5 = (rhs->q_hash).d;
  if (pDVar5 == (Data *)0x0) {
    pDVar5 = (Data *)0x0;
LAB_005d239c:
    uVar4 = 0;
  }
  else {
    if (pDVar5->spans->offsets[0] != 0xff) goto LAB_005d239c;
    uVar3 = 1;
    do {
      uVar4 = uVar3;
      if (pDVar5->numBuckets == uVar4) {
        pDVar5 = (Data *)0x0;
        uVar4 = 0;
        break;
      }
      uVar3 = uVar4 + 1;
    } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
  }
  if (pDVar5 != (Data *)0x0 || uVar4 != 0) {
    do {
      cVar8 = QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>::
              constFindImpl<QtGraphicsAnchorLayout::AnchorData*>
                        ((QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue> *)lhs,
                         (AnchorData **)
                         (pDVar5->spans[uVar4 >> 7].entries +
                         pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f]));
      if (cVar8.i.d !=
          (Data<QHashPrivate::Node<QtGraphicsAnchorLayout::AnchorData_*,_QHashDummyValue>_> *)0x0 ||
          cVar8.i.bucket != 0) {
        pSVar1 = (cVar8.i.d)->spans;
        uVar3 = cVar8.i.bucket >> 7;
        local_40.data =
             *&pSVar1[uVar3].entries[pSVar1[uVar3].offsets[(uint)cVar8.i.bucket & 0x7f]].storage.
               data;
        QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QtGraphicsAnchorLayout::AnchorData*,QHashDummyValue> *)this,
                   (AnchorData **)&local_40,&local_41);
      }
      do {
        if (pDVar5->numBuckets - 1 == uVar4) {
          pDVar5 = (Data *)0x0;
          uVar4 = 0;
          break;
        }
        uVar4 = uVar4 + 1;
      } while (pDVar5->spans[uVar4 >> 7].offsets[(uint)uVar4 & 0x7f] == 0xff);
    } while ((pDVar5 != (Data *)0x0) || (uVar4 != 0));
  }
LAB_005d252a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSet<QtGraphicsAnchorLayout::AnchorData_*>)(Hash)this;
}

Assistant:

auto QSet<T>::intersected_helper(const QSet &lhs, const QSet &rhs) -> QSet
{
    QSet r;

    const auto l_size = lhs.size();
    const auto r_size = rhs.size();
    r.reserve((std::min)(l_size, r_size));

    // Iterate the smaller of the two sets, but always take from lhs, for
    // consistency with insert():

    if (l_size <= r_size) {
        // lhs is not larger
        for (const auto &e : lhs) {
            if (rhs.contains(e))
                r.insert(e);
        }
    } else {
        // rhs is smaller
        for (const auto &e : rhs) {
            if (const auto it = lhs.find(e); it != lhs.end())
                r.insert(*it);
        }
    }

    return r;
}